

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::java::StripProto
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  long *local_40;
  string *local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".protodevel","");
  if ((string *)filename->_M_string_length < local_38) {
    bVar3 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((ulong)filename,(long)filename->_M_string_length - (long)local_38,local_38);
    bVar3 = iVar2 == 0;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (bVar3) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".protodevel","");
    if (local_38 <= (string *)filename->_M_string_length) {
      iVar2 = std::__cxx11::string::compare
                        ((ulong)filename,(long)filename->_M_string_length - (long)local_38,local_38)
      ;
      if (iVar2 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
        goto LAB_00217594;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  }
  else {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".proto","");
    if (local_38 <= (string *)filename->_M_string_length) {
      iVar2 = std::__cxx11::string::compare
                        ((ulong)filename,(long)filename->_M_string_length - (long)local_38,local_38)
      ;
      if (iVar2 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
        goto LAB_00217594;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  }
LAB_00217594:
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string StripProto(const string& filename) {
  if (HasSuffixString(filename, ".protodevel")) {
    return StripSuffixString(filename, ".protodevel");
  } else {
    return StripSuffixString(filename, ".proto");
  }
}